

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O0

BOOL VIRTUALReleaseMemory(PCMI pMemoryToBeReleased)

{
  BOOL bRetVal;
  PCMI pMemoryToBeReleased_local;
  
  if (pMemoryToBeReleased == (PCMI)0x0) {
    fprintf(_stderr,"] %s %s:%d","VIRTUALReleaseMemory",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
            ,0x262);
    fprintf(_stderr,"Invalid pointer.\n");
    pMemoryToBeReleased_local._4_4_ = 0;
  }
  else {
    if (pMemoryToBeReleased == pVirtualMemory) {
      pVirtualMemory = pMemoryToBeReleased->pNext;
      if (pMemoryToBeReleased->pNext != (_CMI *)0x0) {
        pMemoryToBeReleased->pNext->pLast = (_CMI *)0x0;
      }
    }
    else {
      if (pMemoryToBeReleased->pLast != (_CMI *)0x0) {
        pMemoryToBeReleased->pLast->pNext = pMemoryToBeReleased->pNext;
      }
      if (pMemoryToBeReleased->pNext != (_CMI *)0x0) {
        pMemoryToBeReleased->pNext->pLast = pMemoryToBeReleased->pLast;
      }
    }
    if (pMemoryToBeReleased->startBoundary <= pVirtualMemoryLastFound->startBoundary) {
      pVirtualMemoryLastFound = (PCMI)0x0;
    }
    CorUnix::InternalFree(pMemoryToBeReleased->pAllocState);
    pMemoryToBeReleased->pAllocState = (BYTE *)0x0;
    CorUnix::InternalFree(pMemoryToBeReleased->pProtectionState);
    pMemoryToBeReleased->pProtectionState = (BYTE *)0x0;
    CorUnix::InternalFree(pMemoryToBeReleased);
    pMemoryToBeReleased_local._4_4_ = 1;
  }
  return pMemoryToBeReleased_local._4_4_;
}

Assistant:

static BOOL VIRTUALReleaseMemory( PCMI pMemoryToBeReleased )
{
    BOOL bRetVal = TRUE;

    if ( !pMemoryToBeReleased )
    {
        ASSERT( "Invalid pointer.\n" );
        return FALSE;
    }

    if ( pMemoryToBeReleased == pVirtualMemory )
    {
        /* This is either the first entry, or the only entry. */
        pVirtualMemory = pMemoryToBeReleased->pNext;
        if ( pMemoryToBeReleased->pNext )
        {
            pMemoryToBeReleased->pNext->pLast = NULL;
        }
    }
    else /* Could be anywhere in the list. */
    {
        /* Delete the entry from the linked list. */
        if ( pMemoryToBeReleased->pLast )
        {
            pMemoryToBeReleased->pLast->pNext = pMemoryToBeReleased->pNext;
        }

        if ( pMemoryToBeReleased->pNext )
        {
            pMemoryToBeReleased->pNext->pLast = pMemoryToBeReleased->pLast;
        }
    }

    if (pVirtualMemoryLastFound->startBoundary >= pMemoryToBeReleased->startBoundary)
    {
        pVirtualMemoryLastFound = NULL;
    }

#if MMAP_IGNORES_HINT
    // We've removed the block from our allocated list. Add it to the
    // free list.
    bRetVal = VIRTUALAddToFreeList(pMemoryToBeReleased);
#endif  // MMAP_IGNORES_HINT

    InternalFree( pMemoryToBeReleased->pAllocState );
    pMemoryToBeReleased->pAllocState = NULL;

    InternalFree( pMemoryToBeReleased->pProtectionState );
    pMemoryToBeReleased->pProtectionState = NULL;

#if MMAP_DOESNOT_ALLOW_REMAP
    InternalFree( pMemoryToBeReleased->pDirtyPages );
    pMemoryToBeReleased->pDirtyPages = NULL;
#endif // MMAP_DOESNOT_ALLOW_REMAP

    InternalFree( pMemoryToBeReleased );
    pMemoryToBeReleased = NULL;

    return bRetVal;
}